

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status json_array_clear(JSON_Array *array)

{
  ulong uVar1;
  JSON_Value *value;
  ulong uVar2;
  
  if (array != (JSON_Array *)0x0) {
    uVar1 = array->count;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (uVar2 < uVar1) {
          value = array->items[uVar2];
        }
        else {
          value = (JSON_Value *)0x0;
        }
        json_value_free(value);
        uVar2 = uVar2 + 1;
        uVar1 = array->count;
      } while (uVar2 < uVar1);
    }
    array->count = 0;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_clear(JSON_Array *array) {
    size_t i = 0;
    if (array == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_array_get_count(array); i++) {
        json_value_free(json_array_get_value(array, i));
    }
    array->count = 0;
    return JSONSuccess;
}